

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O2

void sendtftp(testcase *test,formats *pf)

{
  int convert;
  ulong uVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  char *msg;
  bool bVar5;
  unsigned_short sendblock;
  tftphdr *sdp;
  
  newline = 0;
  prevchar = -1;
  bfs[0].counter = -3;
  current = 0;
  bfs[1].counter = -2;
  nextone = 1;
  sendblock = 1;
  mysignal(0x105f68,(_func_void_int *)pf);
LAB_00105d40:
  convert = pf->f_convert;
  bVar5 = (ulong)(uint)current == 0;
  bfs[(uint)current].counter = -2;
  current = (int)bVar5;
  uVar4 = bfs[bVar5].counter;
  if (uVar4 == 0xfffffffe) {
    read_ahead(test,convert);
    uVar4 = bfs[bVar5].counter;
  }
  if ((int)uVar4 < 0) {
    piVar3 = __errno_location();
    nak(*piVar3 + 100);
  }
  else {
    bfs[bVar5].buf.hdr.th_opcode = 0x300;
    *(unsigned_short *)((long)&bfs[bVar5].buf + 2) = sendblock << 8 | sendblock >> 8;
    timeout = 0;
    __sigsetjmp(timeoutbuf,1);
    if (test->writedelay != 0) {
      logmsg("Pausing %d seconds before %d bytes",(ulong)(uint)test->writedelay,(ulong)uVar4);
      wait_ms(test->writedelay * 1000);
    }
    while (uVar1 = send(peer,&bfs[bVar5].buf,(ulong)(uVar4 + 4),0x4000), uVar1 == uVar4 + 4) {
      read_ahead(test,pf->f_convert);
      do {
        while( true ) {
          alarm(5);
          sVar2 = recv(peer,&ackbuf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (sVar2 < 0) {
            msg = "read: fail";
            goto LAB_00105efb;
          }
          ackbuf.hdr.th_opcode = ackbuf.hdr.th_opcode << 8 | (ushort)ackbuf.hdr.th_opcode >> 8;
          ackbuf._2_2_ = ackbuf._2_2_ << 8 | (ushort)ackbuf._2_2_ >> 8;
          if (ackbuf.hdr.th_opcode == 4) break;
          if (ackbuf.hdr.th_opcode == 5) {
            msg = "got ERROR";
            goto LAB_00105efb;
          }
        }
        if (ackbuf._2_2_ == sendblock) {
          sendblock = sendblock + 1;
          if (uVar4 != 0x200) {
            return;
          }
          goto LAB_00105d40;
        }
        synchnet(peer);
      } while (sendblock - 1 != (uint)(ushort)ackbuf._2_2_);
    }
    msg = "write";
LAB_00105efb:
    logmsg(msg);
  }
  return;
}

Assistant:

static void sendtftp(struct testcase *test, struct formats *pf)
{
  int size;
  ssize_t n;
  /* These are volatile to live through a siglongjmp */
  volatile unsigned short sendblock; /* block count */
  struct tftphdr * volatile sdp = r_init(); /* data buffer */
  struct tftphdr * const sap = &ackbuf.hdr; /* ack buffer */

  sendblock = 1;
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  do {
    size = readit(test, (struct tftphdr **)&sdp, pf->f_convert);
    if(size < 0) {
      nak(errno + 100);
      return;
    }
    sdp->th_opcode = htons((unsigned short)opcode_DATA);
    sdp->th_block = htons(sendblock);
    timeout = 0;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
    if(test->writedelay) {
      logmsg("Pausing %d seconds before %d bytes", test->writedelay,
             size);
      wait_ms(1000*test->writedelay);
    }

    send_data:
    if(swrite(peer, sdp, size + 4) != size + 4) {
      logmsg("write");
      return;
    }
    read_ahead(test, pf->f_convert);
    for(;;) {
#ifdef HAVE_ALARM
      alarm(rexmtval);        /* read the ack */
#endif
      n = sread(peer, &ackbuf.storage[0], sizeof(ackbuf.storage));
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        return;
      if(n < 0) {
        logmsg("read: fail");
        return;
      }
      sap->th_opcode = ntohs((unsigned short)sap->th_opcode);
      sap->th_block = ntohs(sap->th_block);

      if(sap->th_opcode == opcode_ERROR) {
        logmsg("got ERROR");
        return;
      }

      if(sap->th_opcode == opcode_ACK) {
        if(sap->th_block == sendblock) {
          break;
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if(sap->th_block == (sendblock-1)) {
          goto send_data;
        }
      }

    }
    sendblock++;
  } while(size == SEGSIZE);
}